

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void show_combined_generic
               (renderer_info *info,ui_entry_details *details,wchar_t vcombined,wchar_t acombined)

{
  wchar_t acombined_local;
  wchar_t vcombined_local;
  ui_entry_details combined_details;
  
  acombined_local = acombined;
  vcombined_local = vcombined;
  combined_details.label_position = (loc)loc(0,0);
  combined_details.value_position = details->combined_position;
  combined_details.position_step = (loc)loc(0,0);
  combined_details.combined_position = (loc)loc(0,0);
  combined_details.vertical_label = false;
  combined_details.alternate_color_first = false;
  combined_details.known_rune = details->known_rune;
  combined_details.show_combined = false;
  ui_entry_renderer_apply
            (info->combined_renderer_index,(wchar_t *)0x0,L'\0',&vcombined_local,&acombined_local,
             L'\x01',&combined_details);
  return;
}

Assistant:

static void show_combined_generic(const struct renderer_info *info,
	const struct ui_entry_details *details, int vcombined, int acombined)
{
	struct ui_entry_details combined_details;

	combined_details.label_position = loc(0, 0);
	combined_details.value_position = details->combined_position;
	combined_details.position_step = loc(0, 0);
	combined_details.combined_position = loc(0, 0);
	combined_details.vertical_label = false;
	combined_details.alternate_color_first = false;
	combined_details.known_rune = details->known_rune;
	combined_details.show_combined = false;
	ui_entry_renderer_apply(info->combined_renderer_index, NULL,
		0, &vcombined, &acombined, 1, &combined_details);
}